

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

void __thiscall SymbolKey::SymbolKey(SymbolKey *this,Identifier *name,int file,int section)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (name->_name)._M_string_length);
  this->file = file;
  this->section = section;
  sVar2 = (this->name)._M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (this->name)._M_dataplus._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

SymbolKey(const Identifier& name, int file, int section) :
		name(name.string()),
		file(file),
		section(section)
	{
		std::transform(this->name.begin(), this->name.end(), this->name.begin(), ::tolower);
	}